

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileHourly.cpp
# Opt level: O0

void __thiscall liblogger::LogFileHourly::Rotate(LogFileHourly *this)

{
  int iVar1;
  string *message;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  LogException *in_RDI;
  stringstream ss;
  LogFileHourly *in_stack_00000fe0;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  if (*(long *)((long)&in_RDI[2].m_message.field_2 + 8) != 0) {
    iVar1 = fclose(*(FILE **)((long)&in_RDI[2].m_message.field_2 + 8));
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream(local_190);
      message = (string *)std::operator<<(local_180,"Cannot close file: \'");
      poVar2 = std::operator<<((ostream *)message,(string *)(in_RDI + 2));
      poVar2 = std::operator<<(poVar2,"\' error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      uVar5 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      LogException::LogException(in_RDI,message);
      __cxa_throw(uVar5,&LogException::typeinfo,LogException::~LogException);
    }
    *(undefined8 *)((long)&in_RDI[2].m_message.field_2 + 8) = 0;
  }
  RemoveOld(in_stack_00000fe0);
  return;
}

Assistant:

void LogFileHourly::Rotate()
{
	if (m_fp != NULL)
	{
		if (fclose(m_fp) < 0)
		{
			std::stringstream ss;
			ss << "Cannot close file: '" << m_fname << "' error: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_fp = NULL;
	}
	RemoveOld();
}